

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
          (TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*> *this)

{
  uint uVar1;
  FIntermissionAction **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FIntermissionAction_*,_FIntermissionAction_*>::Size
                        (&this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FIntermissionAction_*,_FIntermissionAction_*>::operator[]
                        (&this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,
                         (ulong)local_14);
    if (*ppFVar2 != (FIntermissionAction *)0x0) {
      ppFVar2 = TArray<FIntermissionAction_*,_FIntermissionAction_*>::operator[]
                          (&this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,
                           (ulong)local_14);
      if (*ppFVar2 != (FIntermissionAction *)0x0) {
        (*(*ppFVar2)->_vptr_FIntermissionAction[1])();
      }
    }
  }
  TArray<FIntermissionAction_*,_FIntermissionAction_*>::~TArray
            (&this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}